

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O3

int xmlPatternMatch(xmlPatternPtr comp,xmlNodePtr node)

{
  xmlPatOp xVar1;
  xmlStepOpPtr pxVar2;
  int iVar3;
  void *pvVar4;
  xmlNodePtr pxVar5;
  xmlStepOpPtr pxVar6;
  ulong uVar7;
  xmlChar *pxVar8;
  xmlChar *str1;
  void *pvVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  _xmlNode *p_Var13;
  ulong local_40;
  
  if (node == (xmlNodePtr)0x0 || comp == (xmlPatternPtr)0x0) {
    return -1;
  }
LAB_0016c7bc:
  if (comp->nbStep < 1) {
    return 1;
  }
  uVar11 = 0;
  local_40 = 0;
  pvVar9 = (void *)0x0;
  iVar12 = 0;
  pxVar5 = node;
  do {
    while( true ) {
      iVar10 = (int)uVar11;
      pxVar2 = comp->steps;
      if (pxVar2[iVar12].op < (XML_OP_ALL|XML_OP_ROOT)) break;
LAB_0016cba7:
      iVar12 = iVar12 + 1;
      if (comp->nbStep <= iVar12) {
switchD_0016c80b_caseD_0:
        if (pvVar9 == (void *)0x0) {
          return 1;
        }
        goto LAB_0016cbe4;
      }
    }
    pxVar6 = pxVar2 + iVar12;
    switch(pxVar2[iVar12].op) {
    case XML_OP_END:
      goto switchD_0016c80b_caseD_0;
    case XML_OP_ROOT:
      if ((pxVar5->type != XML_NAMESPACE_DECL) &&
         (pxVar5 = pxVar5->parent, (pxVar5->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE
         )) goto LAB_0016cba7;
      break;
    case XML_OP_ELEM:
      if (pxVar5->type == XML_ELEMENT_NODE) {
LAB_0016c92f:
        pxVar8 = pxVar6->value;
        if (pxVar8 != (xmlChar *)0x0) {
          if ((*pxVar8 != *pxVar5->name) || (iVar3 = xmlStrEqual(pxVar8,pxVar5->name), iVar3 == 0))
          break;
          if (pxVar5->ns == (xmlNs *)0x0) {
            pxVar8 = pxVar6->value2;
            goto joined_r0x0016ca06;
          }
          pxVar8 = pxVar5->ns->href;
          if (pxVar8 != (xmlChar *)0x0) {
            str1 = pxVar6->value2;
            goto LAB_0016c981;
          }
        }
        goto LAB_0016cba7;
      }
      break;
    case XML_OP_CHILD:
      if (((pxVar5->type < XML_DTD_NODE) &&
          ((0x2202U >> (pxVar5->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) &&
         (pxVar6->value != (xmlChar *)0x0)) {
        for (p_Var13 = pxVar5->children; p_Var13 != (_xmlNode *)0x0; p_Var13 = p_Var13->next) {
          if (p_Var13->type == XML_ELEMENT_NODE) {
            if ((*pxVar6->value == *p_Var13->name) &&
               (iVar3 = xmlStrEqual(pxVar6->value,p_Var13->name), iVar3 != 0)) goto LAB_0016cba7;
          }
        }
      }
      break;
    case XML_OP_ATTR:
      if ((pxVar5->type == XML_ATTRIBUTE_NODE) &&
         ((pxVar8 = pxVar6->value, pxVar8 == (xmlChar *)0x0 ||
          ((*pxVar8 == *pxVar5->name && (iVar3 = xmlStrEqual(pxVar8,pxVar5->name), iVar3 != 0))))))
      {
        str1 = pxVar6->value2;
        if (pxVar5->ns == (xmlNs *)0x0) {
          if (str1 != (xmlChar *)0x0) break;
        }
        else if (str1 != (xmlChar *)0x0) {
          pxVar8 = pxVar5->ns->href;
          goto LAB_0016c9e3;
        }
        goto LAB_0016cba7;
      }
      break;
    case XML_OP_PARENT:
      if (((XML_NAMESPACE_DECL < pxVar5->type) ||
          ((0x42200U >> (pxVar5->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) &&
         (pxVar5 = pxVar5->parent, pxVar5 != (xmlNodePtr)0x0)) goto LAB_0016c92f;
      break;
    case XML_OP_ANCESTOR:
      if (pxVar6->value == (xmlChar *)0x0) {
        iVar12 = iVar12 + 1;
        if (pxVar2[iVar12].op != XML_OP_ELEM) {
          if (pxVar2[iVar12].op != XML_OP_ROOT) break;
          goto switchD_0016c80b_caseD_0;
        }
        pxVar6 = pxVar2 + iVar12;
        if (pxVar6->value == (xmlChar *)0x0) {
          return -1;
        }
      }
      if ((pxVar5 != (xmlNodePtr)0x0) &&
         ((XML_NAMESPACE_DECL < pxVar5->type ||
          ((0x42200U >> (pxVar5->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)))) {
        do {
          while( true ) {
            do {
              do {
                pxVar5 = pxVar5->parent;
                if (pxVar5 == (xmlNodePtr)0x0) goto LAB_0016cb10;
              } while (pxVar5->type != XML_ELEMENT_NODE);
            } while ((*pxVar6->value != *pxVar5->name) ||
                    (iVar3 = xmlStrEqual(pxVar6->value,pxVar5->name), iVar3 == 0));
            if (pxVar5->ns == (xmlNs *)0x0) break;
            pxVar8 = pxVar5->ns->href;
            if (((pxVar8 != (xmlChar *)0x0) && (pxVar6->value2 != (xmlChar *)0x0)) &&
               (iVar3 = xmlStrEqual(pxVar6->value2,pxVar8), iVar3 != 0)) goto LAB_0016caae;
          }
        } while (pxVar6->value2 != (xmlChar *)0x0);
LAB_0016caae:
        xVar1 = pxVar6->op;
        iVar3 = (int)local_40;
        if (iVar3 < 1 || pvVar9 == (void *)0x0) {
          pvVar4 = (*xmlMalloc)(0x40);
          iVar10 = 0;
          uVar7 = 4;
        }
        else {
          pvVar4 = pvVar9;
          uVar7 = local_40;
          if (iVar3 <= iVar10) {
            pvVar4 = (*xmlRealloc)(pvVar9,(ulong)(uint)(iVar3 * 2) << 4);
            uVar7 = (ulong)(uint)(iVar3 * 2);
            if (pvVar4 == (void *)0x0) goto LAB_0016cba7;
          }
        }
        *(uint *)((long)pvVar4 + (long)iVar10 * 0x10) = iVar12 - (uint)(xVar1 != XML_OP_ANCESTOR);
        uVar11 = (ulong)(iVar10 + 1);
        *(xmlNodePtr *)((long)pvVar4 + (long)iVar10 * 0x10 + 8) = pxVar5;
        pvVar9 = pvVar4;
        local_40 = uVar7;
        goto LAB_0016cba7;
      }
      break;
    case XML_OP_NS:
      if (pxVar5->type == XML_ELEMENT_NODE) {
        if (pxVar5->ns == (xmlNs *)0x0) {
          pxVar8 = pxVar6->value;
joined_r0x0016ca06:
          if (pxVar8 == (xmlChar *)0x0) goto LAB_0016cba7;
        }
        else {
          pxVar8 = pxVar5->ns->href;
          if (pxVar8 == (xmlChar *)0x0) goto LAB_0016cba7;
          str1 = pxVar6->value;
LAB_0016c981:
          if (str1 != (xmlChar *)0x0) {
LAB_0016c9e3:
            iVar3 = xmlStrEqual(str1,pxVar8);
            if (iVar3 != 0) goto LAB_0016cba7;
          }
        }
      }
      break;
    case XML_OP_ALL:
      if (pxVar5->type == XML_ELEMENT_NODE) goto LAB_0016cba7;
    }
LAB_0016cb10:
    if (pvVar9 == (void *)0x0) goto LAB_0016cbce;
    if (iVar10 < 1) break;
    uVar11 = (ulong)(iVar10 - 1);
    iVar12 = *(int *)((long)pvVar9 + uVar11 * 0x10);
    pxVar5 = *(xmlNodePtr *)((long)pvVar9 + uVar11 * 0x10 + 8);
    if (comp->nbStep <= iVar12) {
LAB_0016cbe4:
      (*xmlFree)(pvVar9);
      return 1;
    }
  } while( true );
  (*xmlFree)(pvVar9);
LAB_0016cbce:
  comp = comp->next;
  if (comp == (_xmlPattern *)0x0) {
    return 0;
  }
  goto LAB_0016c7bc;
}

Assistant:

int
xmlPatternMatch(xmlPatternPtr comp, xmlNodePtr node)
{
    int ret = 0;

    if ((comp == NULL) || (node == NULL))
        return(-1);

    while (comp != NULL) {
        ret = xmlPatMatch(comp, node);
	if (ret != 0)
	    return(ret);
	comp = comp->next;
    }
    return(ret);
}